

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
csv::internals::_get_col_names_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,internals *this,string_view head,CSVFormat *format)

{
  CSVFormat *format_00;
  ulong uVar1;
  ulong uVar2;
  vector<char,_std::allocator<char>_> trim_chars;
  RowCollection rows;
  stringstream source;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parser;
  vector<char,_std::allocator<char>_> local_9c0;
  CSVRow local_9a8;
  ThreadSafeDeque<csv::CSVRow> local_980;
  stringstream local_8c8 [128];
  ios_base local_848 [264];
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_740;
  
  format_00 = (CSVFormat *)head._M_str;
  std::vector<char,_std::allocator<char>_>::vector(&local_9c0,&format_00->trim_chars);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_740,(char *)head._M_len,(allocator<char> *)&local_980);
  std::__cxx11::stringstream::stringstream(local_8c8,(string *)&local_740,_S_out|_S_in);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_740.super_IBasicCSVParser._vptr_IBasicCSVParser !=
      &local_740.super_IBasicCSVParser.current_row.data.
       super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_740.super_IBasicCSVParser._vptr_IBasicCSVParser,
                    (ulong)((long)&(local_740.super_IBasicCSVParser.current_row.data.
                                    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  ThreadSafeDeque<csv::CSVRow>::ThreadSafeDeque(&local_980,100);
  local_9a8.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_9a8.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::StreamParser(&local_740,
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_8c8,format_00,(ColNamesPtr *)&local_9a8);
  if (local_9a8.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9a8.data.
               super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_740.super_IBasicCSVParser._records = &local_980;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::next(&local_740,10000000);
  uVar1 = ((long)local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl
                 .super__Deque_impl_data._M_start._M_cur -
           (long)local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl
                 .super__Deque_impl_data._M_start._M_first >> 3) * -0x3333333333333333 +
          (long)format_00->header;
  if ((long)uVar1 < 0) {
    uVar2 = ~(~uVar1 / 0xc);
  }
  else {
    if (uVar1 < 0xc) {
      local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur =
           local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur + format_00->header;
      goto LAB_00107379;
    }
    uVar2 = uVar1 / 0xc;
  }
  local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur =
       local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
       super__Deque_impl_data._M_start._M_node[uVar2] + uVar2 * -0xc + uVar1;
LAB_00107379:
  local_9a8.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       ((local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur)->data).
       super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_9a8.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       ((local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur)->data).
       super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  ((local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur)->data).
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur)->data).
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_9a8.row_length =
       (local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur)->row_length;
  local_9a8.data_start =
       (local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur)->data_start;
  local_9a8.fields_start =
       (local_980.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur)->fields_start;
  CSVRow::operator_cast_to_vector(__return_storage_ptr__,&local_9a8);
  if (local_9a8.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9a8.data.
               super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~StreamParser(&local_740);
  std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::~deque(&local_980.data);
  std::condition_variable::~condition_variable(&local_980._cond);
  std::__cxx11::stringstream::~stringstream(local_8c8);
  std::ios_base::~ios_base(local_848);
  if (local_9c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_9c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_9c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_9c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE std::vector<std::string> _get_col_names(csv::string_view head, CSVFormat format) {
            // Parse the CSV
            auto trim_chars = format.get_trim_chars();
            std::stringstream source(head.data());
            RowCollection rows;

            StreamParser<std::stringstream> parser(source, format);
            parser.set_output(rows);
            parser.next();

            return CSVRow(std::move(rows[format.get_header()]));
        }